

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UBool __thiscall
icu_63::Normalizer2Impl::ensureCanonIterData(Normalizer2Impl *this,UErrorCode *errorCode)

{
  UBool UVar1;
  Normalizer2Impl *me;
  UErrorCode *errorCode_local;
  Normalizer2Impl *this_local;
  
  umtx_initOnce<icu_63::Normalizer2Impl*>
            (&this->fCanonIterDataInitOnce,initCanonIterData,this,errorCode);
  UVar1 = ::U_SUCCESS(*errorCode);
  return UVar1;
}

Assistant:

UBool Normalizer2Impl::ensureCanonIterData(UErrorCode &errorCode) const {
    // Logically const: Synchronized instantiation.
    Normalizer2Impl *me=const_cast<Normalizer2Impl *>(this);
    umtx_initOnce(me->fCanonIterDataInitOnce, &initCanonIterData, me, errorCode);
    return U_SUCCESS(errorCode);
}